

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorArkode.cpp
# Opt level: O2

void __thiscall
pele::physics::reactions::ReactorArkode::print_final_stats(ReactorArkode *this,void *arkode_mem)

{
  ostringstream *poVar1;
  ostream *poVar2;
  char *funcname;
  int local_1cc;
  long nfe;
  long netf;
  long nst_a;
  long nst;
  long nfi;
  Print local_1a0;
  
  if (this->use_erkstep == 0) {
    local_1cc = ARKStepGetNumSteps(arkode_mem,&nst);
    utils::check_flag(&local_1cc,"ARKStepGetNumSteps",1);
    local_1cc = ARKStepGetNumStepAttempts(arkode_mem,&nst_a);
    utils::check_flag(&local_1cc,"ARKStepGetNumStepAttempts",1);
    local_1cc = ARKStepGetNumErrTestFails(arkode_mem,&netf);
    utils::check_flag(&local_1cc,"ARKStepGetNumErrTestFails",1);
    local_1cc = ARKStepGetNumRhsEvals(arkode_mem,&nfe,&nfi);
    funcname = "ARKStepGetNumRhsEvals";
  }
  else {
    local_1cc = ERKStepGetNumSteps(arkode_mem,&nst);
    utils::check_flag(&local_1cc,"ERKStepGetNumSteps",1);
    local_1cc = ERKStepGetNumStepAttempts(arkode_mem,&nst_a);
    utils::check_flag(&local_1cc,"ERKStepGetNumStepAttempts",1);
    local_1cc = ERKStepGetNumErrTestFails(arkode_mem,&netf);
    utils::check_flag(&local_1cc,"ERKStepGetNumErrTestFails",1);
    local_1cc = ERKStepGetNumRhsEvals(arkode_mem,&nfe);
    funcname = "ERKStepGetNumRhsEvals";
  }
  utils::check_flag(&local_1cc,funcname,1);
  poVar2 = amrex::OutStream();
  amrex::Print::Print(&local_1a0,poVar2);
  std::operator<<((ostream *)&local_1a0.ss,"\nFinal Statistics:\n");
  amrex::Print::~Print(&local_1a0);
  poVar2 = amrex::OutStream();
  amrex::Print::Print(&local_1a0,poVar2);
  poVar1 = &local_1a0.ss;
  std::operator<<((ostream *)poVar1,"   Internal steps   = ");
  std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<((ostream *)poVar1,"\n");
  amrex::Print::~Print(&local_1a0);
  poVar2 = amrex::OutStream();
  amrex::Print::Print(&local_1a0,poVar2);
  poVar1 = &local_1a0.ss;
  std::operator<<((ostream *)poVar1,"   Attempted steps  = ");
  std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<((ostream *)poVar1,"\n");
  amrex::Print::~Print(&local_1a0);
  poVar2 = amrex::OutStream();
  amrex::Print::Print(&local_1a0,poVar2);
  poVar1 = &local_1a0.ss;
  std::operator<<((ostream *)poVar1,"   Error test fails = ");
  std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<((ostream *)poVar1,"\n");
  amrex::Print::~Print(&local_1a0);
  poVar2 = amrex::OutStream();
  amrex::Print::Print(&local_1a0,poVar2);
  poVar1 = &local_1a0.ss;
  std::operator<<((ostream *)poVar1,"   Total RHS evals  = ");
  std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<((ostream *)poVar1,"\n");
  amrex::Print::~Print(&local_1a0);
  return;
}

Assistant:

void
ReactorArkode::print_final_stats(void* arkode_mem)
{
  long int nst, nst_a, netf, nfe, nfi;
  int flag;

  if (use_erkstep != 0) {
    flag = ERKStepGetNumSteps(arkode_mem, &nst);
    utils::check_flag(&flag, "ERKStepGetNumSteps", 1);
    flag = ERKStepGetNumStepAttempts(arkode_mem, &nst_a);
    utils::check_flag(&flag, "ERKStepGetNumStepAttempts", 1);
    flag = ERKStepGetNumErrTestFails(arkode_mem, &netf);
    utils::check_flag(&flag, "ERKStepGetNumErrTestFails", 1);
    flag = ERKStepGetNumRhsEvals(arkode_mem, &nfe);
    utils::check_flag(&flag, "ERKStepGetNumRhsEvals", 1);

  } else {
    flag = ARKStepGetNumSteps(arkode_mem, &nst);
    utils::check_flag(&flag, "ARKStepGetNumSteps", 1);
    flag = ARKStepGetNumStepAttempts(arkode_mem, &nst_a);
    utils::check_flag(&flag, "ARKStepGetNumStepAttempts", 1);
    flag = ARKStepGetNumErrTestFails(arkode_mem, &netf);
    utils::check_flag(&flag, "ARKStepGetNumErrTestFails", 1);
    flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
    utils::check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  }

#ifdef AMREX_USE_OMP
  amrex::Print() << "\nFinal Statistics: "
                 << "(thread:" << omp_get_thread_num() << ", ";
  amrex::Print() << "arkodeMem:" << arkode_mem << ")\n";
#else
  amrex::Print() << "\nFinal Statistics:\n";
#endif

  amrex::Print() << "   Internal steps   = " << nst << "\n";
  amrex::Print() << "   Attempted steps  = " << nst_a << "\n";
  amrex::Print() << "   Error test fails = " << netf << "\n";
  amrex::Print() << "   Total RHS evals  = " << nfe << "\n";
}